

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setGlobalValue
          (ConstantExpressionRunner<wasm::CExpressionRunner> *this,Name name,Literals *values)

{
  bool bVar1;
  mapped_type *this_00;
  Literals *values_local;
  ConstantExpressionRunner<wasm::CExpressionRunner> *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  bVar1 = Literals::isConcrete(values);
  if (!bVar1) {
    __assert_fail("values.isConcrete()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                  ,0x9ad,
                  "void wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setGlobalValue(Name, Literals &) [SubType = wasm::CExpressionRunner]"
                 );
  }
  this_00 = std::
            unordered_map<wasm::Name,_wasm::Literals,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
            ::operator[](&this->globalValues,(key_type *)&this_local);
  Literals::operator=(this_00,values);
  return;
}

Assistant:

void setGlobalValue(Name name, Literals& values) {
    assert(values.isConcrete());
    globalValues[name] = values;
  }